

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O0

Chuck * FindSmallestFitInHeap(Heap *heap,Size size)

{
  byte bVar1;
  Chuck *pCVar2;
  Size local_30;
  uint local_28;
  uint local_24;
  int i_1;
  int i;
  Chuck *start;
  Size size_local;
  Heap *heap_local;
  
  _i_1 = (Chuck *)0x0;
  if (size < 0x218) {
    bVar1 = MatchExact(size);
    for (local_24 = (uint)bVar1; (int)local_24 < 0x40; local_24 = local_24 + 1) {
      if (heap->exact[(int)local_24] != (Chuck *)0x0) {
        _i_1 = heap->exact[(int)local_24];
        break;
      }
    }
  }
  if (_i_1 == (Chuck *)0x0) {
    local_30 = size;
    if (size < 0x219) {
      local_30 = 0x218;
    }
    bVar1 = MatchSorted(local_30);
    for (local_28 = (uint)bVar1; (int)local_28 < 0x40; local_28 = local_28 + 1) {
      if (heap->sorted[(int)local_28] != (Chuck *)0x0) {
        _i_1 = heap->sorted[(int)local_28];
        break;
      }
    }
  }
  pCVar2 = FindSmallestFit(_i_1,size);
  return pCVar2;
}

Assistant:

static Chuck *FindSmallestFitInHeap(Heap *heap, Size size) {
    Chuck *start = NULL;
    if (size < NOT_EXACT_MIN) {
        for (int i = MatchExact(size); i < 64; i += 1) {
            if (heap->exact[i]) {
                start = heap->exact[i];
                break;
            }
        }
    }
    if (!start) {
        for (int i = MatchSorted(size > NOT_EXACT_MIN ? size : NOT_EXACT_MIN);
             i < 64; i += 1) {
            if (heap->sorted[i]) {
                start = heap->sorted[i];
                break;
            }
        }
    }
    return FindSmallestFit(start, size);
}